

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall
crnlib::dynamic_string::format_args(dynamic_string *this,char *p,__va_list_tag *args)

{
  ushort uVar1;
  uint uVar2;
  char buf [4096];
  char acStack_1018 [4096];
  
  uVar2 = vsnprintf(acStack_1018,0x1000,p,args);
  if ((int)uVar2 < 1) {
    clear(this);
  }
  else {
    uVar1 = this->m_buf_size;
    if (uVar1 <= uVar2 && uVar2 < 0xffff) {
      expand_buf(this,uVar2 + 1,false);
      uVar1 = this->m_buf_size;
    }
    if (uVar2 < uVar1) {
      memcpy(this->m_pStr,acStack_1018,(ulong)(uVar2 + 1));
      this->m_len = (uint16)uVar2;
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::format_args(const char* p, va_list args) {
  CRNLIB_ASSERT(p);

  const uint cBufSize = 4096;
  char buf[cBufSize];

#if defined(_WIN32)
  int l = vsnprintf_s(buf, cBufSize, _TRUNCATE, p, args);
#else
  int l = crnlib_vsnprintf(buf, cBufSize, p, args);
#endif
  if (l <= 0)
    clear();
  else if (ensure_buf(l, false)) {
    memcpy(m_pStr, buf, l + 1);

    m_len = static_cast<uint16>(l);

    check();
  }

  return *this;
}